

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O1

string * __thiscall
expr_tree::texify_abi_cxx11_(string *__return_storage_ptr__,expr_tree *this,expr_node *node)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *par;
  ulong uVar4;
  uint __len;
  ulong __val;
  
  switch(node->type) {
  case '\x01':
    uVar1 = (node->value).integer;
    __val = -uVar1;
    if (0 < (long)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar4 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_00106720;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_00106720;
        }
        if (uVar4 < 10000) goto LAB_00106720;
        bVar2 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_00106720:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar1 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar1 >> 0x3f),__len,__val);
    break;
  case '\x02':
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,0x148,"%f",(node->value).integer);
    break;
  case '\x03':
    par = &this->variable_;
    goto LAB_001066cd;
  case '\x04':
    par = tld::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          at(&this->parameters_,(node->value).integer);
LAB_001066cd:
    ParToTex(__return_storage_ptr__,par);
    break;
  case '\x05':
    OpToTex_abi_cxx11_(__return_storage_ptr__,*(int *)&node->value);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nil","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string expr_tree::texify(const expr_node& node)
{
    switch (node.type) {
    case INT:
        return std::to_string(node.value.integer);
    case FRAC:
        return std::to_string(node.value.frac);
    case OP:
        return OpToTex(node.value.integer);
    case VAR:
        return ParToTex(this->variable_);
    case PAR:
        return ParToTex(this->parameters_.at(node.value.integer));
    default:
        return "nil";
    }
}